

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O0

double __thiscall cppmetrics::WeightedSnapshot::get_value(WeightedSnapshot *this,double quantile)

{
  double lhs;
  bool bVar1;
  uint uVar2;
  int iVar3;
  domain_error *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pEVar4;
  __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
  local_60;
  __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
  local_58 [2];
  Element *local_48;
  Element *local_40;
  __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
  local_38;
  __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
  lb;
  double local_20;
  double quantile_local;
  WeightedSnapshot *this_local;
  
  local_20 = quantile;
  quantile_local = (double)this;
  if ((0.0 <= quantile) && (quantile <= 1.0)) {
    uVar2 = std::isnan(quantile);
    if ((uVar2 & 1) == 0) {
      iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[3])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        this_local = (WeightedSnapshot *)0x0;
      }
      else {
        local_40 = (Element *)
                   std::
                   begin<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                             (&this->m_elements);
        local_48 = (Element *)
                   std::
                   end<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                             (&this->m_elements);
        local_38 = std::
                   lower_bound<__gnu_cxx::__normal_iterator<cppmetrics::WeightedSnapshot::Element_const*,std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>,double,cppmetrics::WeightedSnapshot::get_value(double)const::__0>
                             (local_40,local_48,&local_20);
        local_58[0]._M_current =
             (Element *)
             std::
             begin<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                       (&this->m_elements);
        bVar1 = __gnu_cxx::operator==(&local_38,local_58);
        if (bVar1) {
          iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[4])();
          this_local = (WeightedSnapshot *)(double)CONCAT44(extraout_var_00,iVar3);
        }
        else {
          local_60._M_current =
               (Element *)
               std::
               end<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                         (&this->m_elements);
          bVar1 = __gnu_cxx::operator==(&local_38,&local_60);
          lhs = local_20;
          if (bVar1) {
            iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[6])();
            this_local = (WeightedSnapshot *)(double)CONCAT44(extraout_var_01,iVar3);
          }
          else {
            pEVar4 = __gnu_cxx::
                     __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
                     ::operator->(&local_38);
            bVar1 = anon_unknown_3::HasEquivalentOrder(lhs,pEVar4->quantile);
            if (!bVar1) {
              __gnu_cxx::
              __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
              ::operator--(&local_38);
            }
            pEVar4 = __gnu_cxx::
                     __normal_iterator<const_cppmetrics::WeightedSnapshot::Element_*,_std::vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>_>
                     ::operator->(&local_38);
            this_local = (WeightedSnapshot *)(double)pEVar4->value;
          }
        }
      }
      return (double)this_local;
    }
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this_00,"Quantile must be between 0.0 and 1.0");
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}